

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.H
# Opt level: O0

void amrex::EB2::Build<amrex::EB2::GeometryShop<amrex::EB2::AllRegularIF,int>>
               (GeometryShop<amrex::EB2::AllRegularIF,_int> *gshop,Geometry *geom,
               int required_coarsening_level,int max_coarsening_level,int ngrow,
               bool build_coarse_level_by_coarsening,bool extend_domain_face,int num_coarsen_opt)

{
  IndexSpace *in_RDI;
  undefined1 in_stack_00000292;
  undefined1 in_stack_00000293;
  int in_stack_00000294;
  int in_stack_00000298;
  int in_stack_0000029c;
  Geometry *in_stack_000002a0;
  GeometryShop<amrex::EB2::AllRegularIF,_int> *in_stack_000002a8;
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::AllRegularIF,_int>_> *in_stack_000002b0;
  int in_stack_00000470;
  
  operator_new(0x78);
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::AllRegularIF,_int>_>::IndexSpaceImp
            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_0000029c,
             in_stack_00000298,in_stack_00000294,(bool)in_stack_00000293,(bool)in_stack_00000292,
             in_stack_00000470);
  IndexSpace::push(in_RDI);
  return;
}

Assistant:

void
Build (const G& gshop, const Geometry& geom,
       int required_coarsening_level, int max_coarsening_level,
       int ngrow = 4, bool build_coarse_level_by_coarsening = true,
       bool extend_domain_face = ExtendDomainFace(),
       int num_coarsen_opt = NumCoarsenOpt())
{
    BL_PROFILE("EB2::Initialize()");
    IndexSpace::push(new IndexSpaceImp<G>(gshop, geom,
                                          required_coarsening_level,
                                          max_coarsening_level,
                                          ngrow, build_coarse_level_by_coarsening,
                                          extend_domain_face,
                                          num_coarsen_opt));
}